

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendRuleDepend
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,char *ruleFileName)

{
  cmMakefile *this_00;
  bool bVar1;
  allocator<char> local_41;
  char *local_40;
  string local_38;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_40 = ruleFileName;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_SKIP_RULE_DEPENDENCY",&local_41);
  cmMakefile::GetDefinition(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = cmIsOff((cmValue)0x4141a8);
  if (bVar1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)depends,
               &local_40);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendRuleDepend(
  std::vector<std::string>& depends, const char* ruleFileName)
{
  // Add a dependency on the rule file itself unless an option to skip
  // it is specifically enabled by the user or project.
  cmValue nodep = this->Makefile->GetDefinition("CMAKE_SKIP_RULE_DEPENDENCY");
  if (cmIsOff(nodep)) {
    depends.emplace_back(ruleFileName);
  }
}